

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::_::XThreadEvent*>::addAll<kj::_::XThreadEvent**,true>
          (ArrayBuilder<kj::_::XThreadEvent*> *this,XThreadEvent **start,XThreadEvent **end)

{
  XThreadEvent **ppXVar1;
  XThreadEvent **end_local;
  XThreadEvent **start_local;
  ArrayBuilder<kj::_::XThreadEvent_*> *this_local;
  
  ppXVar1 = kj::_::CopyConstructArray_<kj::_::XThreadEvent_*,_kj::_::XThreadEvent_**,_true,_false>::
            apply(*(XThreadEvent ***)(this + 8),start,end);
  *(XThreadEvent ***)(this + 8) = ppXVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}